

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O1

void proto2_unittest::ComplexOptionType1::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  ulong uVar2;
  Nonnull<const_char_*> pcVar3;
  
  if (from_msg == to_msg) {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar3 != (Nonnull<const_char_*>)0x0) {
    MergeImpl();
  }
  google::protobuf::RepeatedField<int>::MergeFrom
            ((RepeatedField<int> *)(to_msg + 3),(RepeatedField<int> *)(from_msg + 3));
  uVar1 = (uint)from_msg[2]._internal_metadata_.ptr_;
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      *(undefined4 *)&to_msg[4]._vptr_MessageLite = *(undefined4 *)&from_msg[4]._vptr_MessageLite;
    }
    if ((uVar1 & 2) != 0) {
      *(undefined4 *)((long)&to_msg[4]._vptr_MessageLite + 4) =
           *(undefined4 *)((long)&from_msg[4]._vptr_MessageLite + 4);
    }
    if ((uVar1 & 4) != 0) {
      *(int *)&to_msg[4]._internal_metadata_.ptr_ = (int)from_msg[4]._internal_metadata_.ptr_;
    }
  }
  *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | uVar1;
  google::protobuf::internal::ExtensionSet::MergeFrom
            ((ExtensionSet *)(to_msg + 1),(MessageLite *)_ComplexOptionType1_default_instance_,
             (ExtensionSet *)(from_msg + 1));
  uVar2 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar2 & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void ComplexOptionType1::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<ComplexOptionType1*>(&to_msg);
  auto& from = static_cast<const ComplexOptionType1&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.ComplexOptionType1)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_foo4()->MergeFrom(from._internal_foo4());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_impl_.foo_ = from._impl_.foo_;
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.foo2_ = from._impl_.foo2_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.foo3_ = from._impl_.foo3_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}